

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.hh
# Opt level: O0

void kratos::print_nodes<kratos::IRNode_const*>
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *nodes)

{
  bool bVar1;
  reference ppIVar2;
  IRNode **node;
  const_iterator __end0;
  const_iterator __begin0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *__range2;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *nodes_local;
  
  __end0 = std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::begin
                     (nodes);
  node = (IRNode **)
         std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::end(nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_kratos::IRNode_*const_*,_std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>_>
                                *)&node);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<const_kratos::IRNode_*const_*,_std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>_>
              ::operator*(&__end0);
    if (*ppIVar2 != (IRNode *)0x0) {
      print_ast_node(*ppIVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_kratos::IRNode_*const_*,_std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void print_nodes(const std::vector<T> &nodes) {
    for (auto const &node : nodes) {
        if (node)
            print_ast_node(node);
    }
}